

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.cpp
# Opt level: O3

Vector * __thiscall Clusters::append_a_cluster(Clusters *this,unsigned_long sequence_id)

{
  ulong uVar1;
  Vector **ppVVar2;
  unsigned_long uVar3;
  Vector **ppVVar4;
  Vector *this_00;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar3 = this->unused;
  if (uVar3 == 0) {
    uVar6 = this->cluster_count;
    if (uVar6 == this->allocated_clusters) {
      uVar7 = 0x80;
      if (0x200 < uVar6) {
        uVar7 = uVar6 >> 2;
      }
      uVar1 = uVar7 + uVar6;
      ppVVar4 = (Vector **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
      if (uVar6 != 0) {
        ppVVar2 = this->list_of_clusters;
        uVar5 = 0;
        do {
          ppVVar4[uVar5] = ppVVar2[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar6 != uVar5);
      }
      if (uVar6 < uVar1) {
        memset(ppVVar4 + uVar6,0,uVar7 << 3);
      }
      if (this->list_of_clusters != (Vector **)0x0) {
        operator_delete__(this->list_of_clusters);
      }
      this->allocated_clusters = uVar1;
      this->list_of_clusters = ppVVar4;
    }
  }
  else {
    if (this->allocated_clusters != 0) {
      uVar6 = 0;
      do {
        uVar3 = uVar3 - 1;
        if (this->list_of_clusters[uVar6] == (Vector *)0x0) goto LAB_00105ba7;
        this->unused = uVar3;
        uVar6 = uVar6 + 1;
      } while (this->allocated_clusters != uVar6);
    }
    uVar6 = 0;
  }
LAB_00105ba7:
  this_00 = (Vector *)operator_new(0x18);
  Vector::Vector(this_00);
  this->list_of_clusters[uVar6] = this_00;
  Vector::appendValue(this_00,sequence_id);
  this->cluster_count = this->cluster_count + 1;
  return this_00;
}

Assistant:

Vector *append_a_cluster(unsigned long sequence_id) {
    /** allocate a new cluster and seed it with sequence sequence_id

     @param sequence_id

     return the new cluster vector
     */

    unsigned long slot = 0UL;

    if (unused > 0UL) {
      for (unsigned long k = 0UL; k < allocated_clusters; k++) {
        if (list_of_clusters[k] == NULL) {
          slot = k;
          break;
        }
        unused--;
      }
    } else {
      slot = cluster_count;
      if (cluster_count == allocated_clusters) {
        unsigned long new_allocation =
            allocated_clusters +
            (allocated_clusters > 512UL ? (allocated_clusters >> 2) : 128UL);
        Vector **new_vectors = new Vector *[new_allocation];

        for (unsigned long k = 0UL; k < allocated_clusters; k++) {
          new_vectors[k] = list_of_clusters[k];
        }
        for (unsigned long k = allocated_clusters; k < new_allocation; k++) {
          new_vectors[k] = NULL;
        }

        delete[] list_of_clusters;
        allocated_clusters = new_allocation;
        list_of_clusters = new_vectors;
      }
    }

    Vector *new_vector = (list_of_clusters[slot] = new Vector);
    new_vector->appendValue(sequence_id);
    cluster_count++;
    return new_vector;
  }